

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::javanano::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,javanano *this,Params *params,FieldDescriptor *field)

{
  float value;
  double value_00;
  CppType CVar1;
  Type TVar2;
  LogMessage *pLVar3;
  Params *params_00;
  EnumValueDescriptor *pEVar4;
  uint *descriptor;
  FieldDescriptor *field_00;
  char *pcVar5;
  javanano *this_00;
  LogMessage LStack_98;
  string local_60;
  string local_40;
  
  pLVar3 = &LStack_98;
  if (*(int *)&(params->java_packages_)._M_t._M_impl.field_0x4 == 3) {
    EmptyArrayName_abi_cxx11_(__return_storage_ptr__,this,params,field);
    return __return_storage_ptr__;
  }
  if (this[0xdb] == (javanano)0x1) {
    if ((this[0xdf] == (javanano)0x1) &&
       (CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)params), CVar1 == CPPTYPE_ENUM)) {
      pcVar5 = "Integer.MIN_VALUE";
      goto LAB_002521fa;
    }
switchD_002521e0_caseD_a:
    pcVar5 = "null";
    goto LAB_002521fa;
  }
  this_00 = this;
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)params);
  descriptor = &switchD_002521e0::switchdataD_00346f9c;
  switch(CVar1) {
  case CPPTYPE_INT32:
  case CPPTYPE_UINT32:
    SimpleItoa_abi_cxx11_
              (__return_storage_ptr__,
               (protobuf *)
               (ulong)(uint)(params->java_outer_classnames_)._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,(int)field_00);
    return __return_storage_ptr__;
  case CPPTYPE_INT64:
    SimpleItoa_abi_cxx11_
              ((string *)&LStack_98,
               (protobuf *)
               (params->java_outer_classnames_)._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (long)field_00);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&LStack_98,
                   "L");
    goto LAB_0025239c;
  case CPPTYPE_UINT64:
    SimpleItoa_abi_cxx11_
              ((string *)&LStack_98,
               (protobuf *)
               (params->java_outer_classnames_)._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (long)field_00);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&LStack_98,
                   "L");
    pLVar3 = &LStack_98;
    goto LAB_0025239c;
  case CPPTYPE_DOUBLE:
    value_00 = (double)(params->java_outer_classnames_)._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count;
    if (value_00 < INFINITY) {
      if (-INFINITY < value_00) {
        if (!NAN(value_00)) {
          SimpleDtoa_abi_cxx11_((string *)&LStack_98,(protobuf *)this_00,value_00);
          std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &LStack_98,"D");
          pLVar3 = &LStack_98;
          goto LAB_0025239c;
        }
        pcVar5 = "Double.NaN";
      }
      else {
        pcVar5 = "Double.NEGATIVE_INFINITY";
      }
    }
    else {
      pcVar5 = "Double.POSITIVE_INFINITY";
    }
    break;
  case CPPTYPE_FLOAT:
    value = *(float *)&(params->java_outer_classnames_)._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count;
    if (value < INFINITY) {
      if (-INFINITY < value) {
        if (!NAN(value)) {
          SimpleFtoa_abi_cxx11_((string *)&LStack_98,(protobuf *)this_00,value);
          std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &LStack_98,"F");
          pLVar3 = &LStack_98;
          goto LAB_0025239c;
        }
        pcVar5 = "Float.NaN";
      }
      else {
        pcVar5 = "Float.NEGATIVE_INFINITY";
      }
    }
    else {
      pcVar5 = "Float.POSITIVE_INFINITY";
    }
    break;
  case CPPTYPE_BOOL:
    pcVar5 = "false";
    if ((char)(params->java_outer_classnames_)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
        '\0') {
      pcVar5 = "true";
    }
    break;
  case CPPTYPE_ENUM:
    params_00 = (Params *)FieldDescriptor::enum_type((FieldDescriptor *)params);
    ClassName_abi_cxx11_(&local_40,this,params_00,(EnumDescriptor *)descriptor);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&LStack_98,
                   &local_40,".");
    pEVar4 = FieldDescriptor::default_value_enum((FieldDescriptor *)params);
    RenameJavaKeywords(&local_60,*(string **)pEVar4);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&LStack_98,
                   &local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&LStack_98);
    pLVar3 = (LogMessage *)&local_40;
LAB_0025239c:
    std::__cxx11::string::~string((string *)pLVar3);
    return __return_storage_ptr__;
  case CPPTYPE_STRING:
    if (*(long *)((params->java_outer_classnames_)._M_t._M_impl.super__Rb_tree_header._M_node_count
                 + 8) != 0) {
      FieldDefaultConstantName_abi_cxx11_(__return_storage_ptr__,(javanano *)params,field_00);
      return __return_storage_ptr__;
    }
    TVar2 = FieldDescriptor::type((FieldDescriptor *)params);
    if (TVar2 == TYPE_BYTES) {
      pcVar5 = "com.google.protobuf.nano.WireFormatNano.EMPTY_BYTES";
    }
    else {
      pcVar5 = "\"\"";
    }
    break;
  case CPPTYPE_MESSAGE:
    goto switchD_002521e0_caseD_a;
  default:
    internal::LogMessage::LogMessage
              (&LStack_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_helpers.cc"
               ,0x1de);
    pLVar3 = internal::LogMessage::operator<<(&LStack_98,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)&local_40,pLVar3);
    internal::LogMessage::~LogMessage(&LStack_98);
    pcVar5 = "";
  }
LAB_002521fa:
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,(allocator *)&LStack_98);
  return __return_storage_ptr__;
}

Assistant:

string DefaultValue(const Params& params, const FieldDescriptor* field) {
  if (field->label() == FieldDescriptor::LABEL_REPEATED) {
    return EmptyArrayName(params, field);
  }

  if (params.use_reference_types_for_primitives()) {
    if (params.reftypes_primitive_enums()
          && field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      return "Integer.MIN_VALUE";
    }
    return "null";
  }

  // Switch on cpp_type since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return SimpleItoa(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      // Need to print as a signed int since Java has no unsigned.
      return SimpleItoa(static_cast<int32>(field->default_value_uint32()));
    case FieldDescriptor::CPPTYPE_INT64:
      return SimpleItoa(field->default_value_int64()) + "L";
    case FieldDescriptor::CPPTYPE_UINT64:
      return SimpleItoa(static_cast<int64>(field->default_value_uint64())) +
             "L";
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == numeric_limits<double>::infinity()) {
        return "Double.POSITIVE_INFINITY";
      } else if (value == -numeric_limits<double>::infinity()) {
        return "Double.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Double.NaN";
      } else {
        return SimpleDtoa(value) + "D";
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value = field->default_value_float();
      if (value == numeric_limits<float>::infinity()) {
        return "Float.POSITIVE_INFINITY";
      } else if (value == -numeric_limits<float>::infinity()) {
        return "Float.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Float.NaN";
      } else {
        return SimpleFtoa(value) + "F";
      }
    }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_STRING:
      if (!field->default_value_string().empty()) {
        // Point it to the static final in the generated code.
        return FieldDefaultConstantName(field);
      } else {
        if (field->type() == FieldDescriptor::TYPE_BYTES) {
          return "com.google.protobuf.nano.WireFormatNano.EMPTY_BYTES";
        } else {
          return "\"\"";
        }
      }

    case FieldDescriptor::CPPTYPE_ENUM:
      return ClassName(params, field->enum_type()) + "." +
             RenameJavaKeywords(field->default_value_enum()->name());

    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "null";

    // No default because we want the compiler to complain if any new
    // types are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}